

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
* __thiscall
helics::CloneOperator::processVector
          (vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           *__return_storage_ptr__,CloneOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _Head_base<0UL,_helics::Message_*,_false> local_10;
  
  if ((this->evalFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_10._M_head_impl =
         (message->_M_t).
         super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    (*(this->evalFunction)._M_invoker)
              (__return_storage_ptr__,(_Any_data *)&this->evalFunction,&local_10._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Message>> CloneOperator::processVector(std::unique_ptr<Message> message)
{
    if (evalFunction) {
        return evalFunction(message.get());
    }
    return {};
}